

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O0

cmplx klogic::transform::continuous(double x)

{
  complex<double> cVar1;
  double local_28;
  double local_20;
  double x_local;
  
  local_20 = x;
  if (x < 0.0 || 6.283185307179586 <= x) {
    __assert_fail("x >= 0 && x < TWOPI",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/transforms.h"
                  ,0x2c,"cmplx klogic::transform::continuous(double)");
  }
  local_28 = 1.0;
  cVar1 = std::polar<double>(&local_28,&local_20);
  return (cmplx)cVar1._M_value;
}

Assistant:

inline cmplx continuous(double x) {
            assert(x >= 0 && x < TWOPI);

            return std::polar(1.0, x);
        }